

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

void __thiscall glauber::WoodsSaxonNucleus::sample_nucleons_impl(WoodsSaxonNucleus *this)

{
  bool bVar1;
  Nucleus *in_RDI;
  double __x;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double y;
  double x;
  double r_sin_theta;
  double phi;
  double cos_theta;
  result_type_conflict r;
  Nucleon *nucleon;
  iterator __end1;
  iterator __begin1;
  WoodsSaxonNucleus *__range1;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffff88;
  Nucleon *in_stack_ffffffffffffff90;
  Nucleon *nucleon_00;
  __normal_iterator<glauber::Nucleon_*,_std::vector<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>_>
  local_18 [3];
  
  local_18[0]._M_current = (Nucleon *)Nucleus::begin((Nucleus *)in_stack_ffffffffffffff88);
  Nucleus::end((Nucleus *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<glauber::Nucleon_*,_std::vector<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<glauber::Nucleon_*,_std::vector<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<glauber::Nucleon_*,_std::vector<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>_>
    ::operator*(local_18);
    in_stack_ffffffffffffff88 =
         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *)std::piecewise_linear_distribution<double>::operator()
                      ((piecewise_linear_distribution<double> *)in_stack_ffffffffffffff90,
                       in_stack_ffffffffffffff88);
    auVar3._0_8_ = random::cos_theta<double>();
    __x = random::phi<double>();
    auVar3._8_8_ = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = -auVar3._0_8_;
    auVar3 = vfmadd213sd_fma(auVar3,auVar4,ZEXT816(0x3ff0000000000000));
    dVar2 = sqrt(auVar3._0_8_);
    nucleon_00 = (Nucleon *)((double)in_stack_ffffffffffffff88 * dVar2);
    in_stack_ffffffffffffff90 = nucleon_00;
    cos(__x);
    sin(__x);
    Nucleus::set_nucleon_position
              (in_RDI,nucleon_00,(double)in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88
              );
    __gnu_cxx::
    __normal_iterator<glauber::Nucleon_*,_std::vector<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void WoodsSaxonNucleus::sample_nucleons_impl() {
  for (auto&& nucleon : *this) {
    // Sample spherical radius from Woods-Saxon distribution.
    auto r = woods_saxon_dist_(random::engine);

    // Sample isotropic spherical angles.
    auto cos_theta = random::cos_theta<double>();
    auto phi = random::phi<double>();

    // Convert to transverse Cartesian coordinates
    auto r_sin_theta = r * std::sqrt(1. - cos_theta*cos_theta);
    auto x = r_sin_theta * std::cos(phi);
    auto y = r_sin_theta * std::sin(phi);

    set_nucleon_position(nucleon, x, y);
  }
  // XXX: re-center nucleon positions?
}